

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void CP_LockReaderDefinitionsHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  SstStream s;
  WS_ReaderInfo CP_WSR_Stream;
  void *__ptr;
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (_perfstubs_initialized == 1) {
    pvVar1 = CP_LockReaderDefinitionsHandler::timer;
    if (CP_LockReaderDefinitionsHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_LockReaderDefinitionsHandler",0xa72);
      pvVar1 = (void *)ps_timer_create_(__ptr);
      CP_LockReaderDefinitionsHandler::timer = pvVar1;
      free(__ptr);
    }
    ps_timer_start_(pvVar1);
  }
  s = (*Msg_v)->ParentStream;
  if ((long)s->ReaderCount < 1) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffff;
    uVar4 = 0;
    do {
      if (*Msg_v == s->Readers[uVar4]) {
        uVar3 = uVar4 & 0xffffffff;
      }
      uVar2 = (uint)uVar3;
      uVar4 = uVar4 + 1;
    } while ((long)s->ReaderCount != uVar4);
  }
  CP_verbose(s,TraceVerbose,
             "Received a lock reader definitions message for timestep %ld from reader cohort %d\n",
             *(undefined8 *)((long)Msg_v + 8),(ulong)uVar2);
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  if (s->Rank == 0) {
    CP_WSR_Stream = s->Readers[(int)uVar2];
    CP_WSR_Stream->LocalReaderDefinitionsLocked = 1;
    UpdateLockDefnsList(s,CP_WSR_Stream,-1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  if (_perfstubs_initialized != 1) {
    return;
  }
  ps_timer_stop_(CP_LockReaderDefinitionsHandler::timer);
  return;
}

Assistant:

extern void CP_LockReaderDefinitionsHandler(CManager cm, CMConnection conn, void *Msg_v,
                                            void *client_data, attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReleaseTimestepMsg *Msg = (struct _ReleaseTimestepMsg *)Msg_v;
    WS_ReaderInfo Reader = (WS_ReaderInfo)Msg->WSR_Stream;
    SstStream ParentStream = Reader->ParentStream;
    int ReaderNum = -1;

    for (int i = 0; i < ParentStream->ReaderCount; i++)
    {
        if (Reader == ParentStream->Readers[i])
        {
            ReaderNum = i;
        }
    }
    CP_verbose(ParentStream, TraceVerbose,
               "Received a lock reader definitions message "
               "for timestep %ld from reader cohort %d\n",
               Msg->Timestep, ReaderNum);

    STREAM_MUTEX_LOCK(ParentStream);
    if (ParentStream->Rank == 0)
    {
        ParentStream->Readers[ReaderNum]->LocalReaderDefinitionsLocked = 1;
        UpdateLockDefnsList(ParentStream, ParentStream->Readers[ReaderNum], -1);
    }
    STREAM_MUTEX_UNLOCK(ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}